

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O2

int gotcha_strncmp(char *in_one,char *in_two,int max_length)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)max_length;
  if (max_length < 1) {
    uVar4 = 0;
  }
  uVar3 = 0;
  while( true ) {
    if (uVar4 == uVar3) {
      return 0;
    }
    cVar1 = in_one[uVar3];
    cVar2 = in_two[uVar3];
    if (cVar1 == '\0') break;
    uVar3 = uVar3 + 1;
    if (cVar1 != cVar2) {
      return (int)cVar1 - (int)cVar2;
    }
  }
  return (uint)(cVar2 != '\0');
}

Assistant:

int gotcha_strncmp(const char *in_one, const char *in_two, int max_length) {
  int i = 0;
  for (; i < max_length; i++) {
    if (in_one[i] == '\0') {
      return (in_two[i] == '\0') ? 0 : 1;
    }
    if (in_one[i] != in_two[i]) {
      return in_one[i] - in_two[i];
    }
  }
  return 0;
}